

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void resetAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pList;
  int addr;
  KeyInfo *zP4;
  int *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (pAggInfo->nFunc + pAggInfo->nColumn != 0) {
    p = pParse->pVdbe;
    if (0 < pAggInfo->nColumn) {
      lVar3 = 0x14;
      lVar4 = 0;
      do {
        sqlite3VdbeAddOp3(p,10,0,*(int *)((long)&pAggInfo->aCol->pTab + lVar3),0);
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x20;
      } while (lVar4 < pAggInfo->nColumn);
    }
    if (0 < pAggInfo->nFunc) {
      piVar1 = &pAggInfo->aFunc->iDistinct;
      iVar2 = 0;
      do {
        sqlite3VdbeAddOp3(p,10,0,piVar1[-1],0);
        if (-1 < *piVar1) {
          pList = (((AggInfo_func *)(piVar1 + -5))->pExpr->x).pList;
          if ((pList == (ExprList *)0x0) || (pList->nExpr != 1)) {
            sqlite3ErrorMsg(pParse,"DISTINCT aggregates must have exactly one argument");
            *piVar1 = -1;
          }
          else {
            zP4 = keyInfoFromExprList(pParse,pList);
            addr = sqlite3VdbeAddOp3(p,0x2a,*piVar1,0,0);
            sqlite3VdbeChangeP4(p,addr,(char *)zP4,-0x10);
          }
        }
        iVar2 = iVar2 + 1;
        piVar1 = piVar1 + 6;
      } while (iVar2 < pAggInfo->nFunc);
    }
  }
  return;
}

Assistant:

static void resetAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pFunc;
  if( pAggInfo->nFunc+pAggInfo->nColumn==0 ){
    return;
  }
  for(i=0; i<pAggInfo->nColumn; i++){
    sqlite3VdbeAddOp2(v, OP_Null, 0, pAggInfo->aCol[i].iMem);
  }
  for(pFunc=pAggInfo->aFunc, i=0; i<pAggInfo->nFunc; i++, pFunc++){
    sqlite3VdbeAddOp2(v, OP_Null, 0, pFunc->iMem);
    if( pFunc->iDistinct>=0 ){
      Expr *pE = pFunc->pExpr;
      assert( !ExprHasProperty(pE, EP_xIsSelect) );
      if( pE->x.pList==0 || pE->x.pList->nExpr!=1 ){
        sqlite3ErrorMsg(pParse, "DISTINCT aggregates must have exactly one "
           "argument");
        pFunc->iDistinct = -1;
      }else{
        KeyInfo *pKeyInfo = keyInfoFromExprList(pParse, pE->x.pList);
        sqlite3VdbeAddOp4(v, OP_OpenEphemeral, pFunc->iDistinct, 0, 0,
                          (char*)pKeyInfo, P4_KEYINFO_HANDOFF);
      }
    }
  }
}